

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::GLES2ThreadedSharingTest::init(GLES2ThreadedSharingTest *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  Functions *dst;
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  *this_00;
  EGLThread *pEVar2;
  pointer ppEVar3;
  EGLThread *pEVar4;
  SharedPtrStateBase *pSVar5;
  uint uVar6;
  Library *egl;
  EGLDisplay pvVar7;
  EGLConfig pvVar8;
  Thread *pTVar9;
  CreateContext *pCVar10;
  CreatePBufferSurface *pCVar11;
  MakeCurrent *pMVar12;
  InitGLExtension *pIVar13;
  DestroyContext *pDVar14;
  DestroySurface *pDVar15;
  SharedPtrStateBase *pSVar16;
  GLenum type;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface1;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex2;
  EGLint attribList [7];
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_178;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_168;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_158;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_148;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_138;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_128;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_78;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_68;
  EGLint local_58 [10];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_58[4] = 0x3021;
  local_58[5] = 1;
  local_58[6] = 0x3038;
  local_58[0] = 0x3040;
  local_58[1] = 4;
  local_58[2] = 0x3033;
  local_58[3] = 4;
  pvVar7 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar7;
  pvVar8 = eglu::chooseSingleConfig(egl,pvVar7,local_58);
  this->m_eglConfig = pvVar8;
  dst = &this->m_gl;
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
  if ((this->m_config).useFenceSync == true) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_fence_sync");
  }
  if ((this->m_config).serverSync == true) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_wait_sync");
  }
  if ((this->m_config).resourceType == RESOURCETYPE_IMAGE) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_image_base");
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_gl_texture_2D_image");
  }
  pTVar9 = (Thread *)operator_new(200);
  uVar6 = ((uint)this->m_seed >> 0x10 ^ this->m_seed ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  tcu::ThreadUtil::Thread::Thread(pTVar9,uVar6 >> 0xf ^ uVar6);
  this_00 = &this->m_threads;
  (pTVar9->super_Thread)._vptr_Thread = (_func_int **)&PTR__EGLThread_021187d8;
  pTVar9[1].super_Thread._vptr_Thread = (_func_int **)egl;
  *(Functions **)&pTVar9[1].super_Thread.m_attribs = dst;
  pTVar9[1].super_Thread.m_thread = 0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar9[1].m_random.m_rnd.x = 0;
  pTVar9[1].m_random.m_rnd.y = 0;
  pTVar9[1].m_random.m_rnd.z = 0;
  pTVar9[1].m_random.m_rnd.w = 0;
  pTVar9[1].m_messageLock.m_mutex = 0;
  local_178.m_ptr = (GLES2Context *)pTVar9;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
  ::emplace_back<deqp::egl::GLES2ThreadTest::EGLThread*>
            ((vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
              *)this_00,(EGLThread **)&local_178);
  pTVar9 = (Thread *)operator_new(200);
  uVar6 = this->m_seed * 200;
  uVar6 = (uVar6 >> 0x10 ^ uVar6 ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  tcu::ThreadUtil::Thread::Thread(pTVar9,uVar6 >> 0xf ^ uVar6);
  (pTVar9->super_Thread)._vptr_Thread = (_func_int **)&PTR__EGLThread_021187d8;
  pTVar9[1].super_Thread._vptr_Thread = (_func_int **)egl;
  *(Functions **)&pTVar9[1].super_Thread.m_attribs = dst;
  pTVar9[1].super_Thread.m_thread = 0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar9[1].m_operations.
  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar9[1].m_random.m_rnd.x = 0;
  pTVar9[1].m_random.m_rnd.y = 0;
  pTVar9[1].m_random.m_rnd.z = 0;
  pTVar9[1].m_random.m_rnd.w = 0;
  pTVar9[1].m_messageLock.m_mutex = 0;
  local_178.m_ptr = (GLES2Context *)pTVar9;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
  ::emplace_back<deqp::egl::GLES2ThreadTest::EGLThread*>
            ((vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
              *)this_00,(EGLThread **)&local_178);
  local_178.m_ptr = (GLES2Context *)0x0;
  local_178.m_state = (SharedPtrStateBase *)0x0;
  local_f8.m_ptr = (GLES2Context *)0x0;
  local_f8.m_state = (SharedPtrStateBase *)0x0;
  local_108.m_ptr = (Surface *)0x0;
  local_108.m_state = (SharedPtrStateBase *)0x0;
  local_118.m_ptr = (Surface *)0x0;
  local_118.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = (CreateContext *)operator_new(0x68);
  local_a8.m_ptr = (GLES2Context *)0x0;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::CreateContext::CreateContext
            (pCVar10,this->m_eglDisplay,this->m_eglConfig,&local_a8,&local_178);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar10);
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.m_ptr = (GLES2Context *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pEVar2 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pCVar10 = (CreateContext *)operator_new(0x68);
  pvVar7 = this->m_eglDisplay;
  pvVar8 = this->m_eglConfig;
  local_128.m_ptr = local_178.m_ptr;
  local_128.m_state = local_178.m_state;
  if (local_178.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_178.m_state)->strongRefCount = (local_178.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_178.m_state)->weakRefCount = (local_178.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::CreateContext::CreateContext(pCVar10,pvVar7,pvVar8,&local_128,&local_f8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar10);
  if (local_128.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_128.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_128.m_ptr = (GLES2Context *)0x0;
      (*(local_128.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_128.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_128.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_128.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_128.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pEVar2 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar11,this->m_eglDisplay,this->m_eglConfig,400,400,&local_108);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar11);
  pEVar2 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pCVar11 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar11,this->m_eglDisplay,this->m_eglConfig,400,400,&local_118);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar11);
  ppEVar3 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = *ppEVar3;
  pMVar12 = (MakeCurrent *)operator_new(0x60);
  pEVar4 = *ppEVar3;
  pvVar7 = this->m_eglDisplay;
  local_b8.m_ptr = local_108.m_ptr;
  local_b8.m_state = local_108.m_state;
  if (local_108.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.m_state)->strongRefCount = (local_108.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.m_state)->weakRefCount = (local_108.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_c8.m_ptr = local_178.m_ptr;
  local_c8.m_state = local_178.m_state;
  if (local_178.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_178.m_state)->strongRefCount = (local_178.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_178.m_state)->weakRefCount = (local_178.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar12,pEVar4,pvVar7,&local_b8,&local_c8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pMVar12);
  pSVar5 = local_c8.m_state;
  if (local_c8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_c8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8.m_ptr = (GLES2Context *)0x0;
      (*(local_c8.m_state)->_vptr_SharedPtrStateBase[2])(local_c8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_c8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_c8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_c8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar5 = local_b8.m_state;
  if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_b8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_b8.m_ptr = (Surface *)0x0;
      (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])(local_b8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_b8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  ppEVar3 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = ppEVar3[1];
  pMVar12 = (MakeCurrent *)operator_new(0x60);
  pEVar4 = ppEVar3[1];
  pvVar7 = this->m_eglDisplay;
  local_d8.m_ptr = local_118.m_ptr;
  local_d8.m_state = local_118.m_state;
  if (local_118.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_118.m_state)->strongRefCount = (local_118.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_118.m_state)->weakRefCount = (local_118.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_e8.m_ptr = local_f8.m_ptr;
  local_e8.m_state = local_f8.m_state;
  if (local_f8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_f8.m_state)->strongRefCount = (local_f8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_f8.m_state)->weakRefCount = (local_f8.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar12,pEVar4,pvVar7,&local_d8,&local_e8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pMVar12);
  pSVar5 = local_e8.m_state;
  if (local_e8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_e8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_e8.m_ptr = (GLES2Context *)0x0;
      (*(local_e8.m_state)->_vptr_SharedPtrStateBase[2])(local_e8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_e8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_e8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_e8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar5 = local_d8.m_state;
  if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.m_ptr = (Surface *)0x0;
      (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])(local_d8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if ((this->m_config).useFenceSync == true) {
    pEVar2 = *(this_00->
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pIVar13 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar13,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pIVar13);
    pEVar2 = (this_00->
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1];
    pIVar13 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar13,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pIVar13);
  }
  switch((this->m_config).resourceType) {
  case RESOURCETYPE_BUFFER:
    addBufferOperations(this);
    break;
  case RESOURCETYPE_TEXTURE:
    addTextureOperations(this);
    break;
  case RESOURCETYPE_VERTEX_SHADER:
    type = 0x8b31;
    goto LAB_00e03327;
  case RESOURCETYPE_FRAGMENT_SHADER:
    type = 0x8b30;
LAB_00e03327:
    addShaderOperations(this,type);
    break;
  case RESOURCETYPE_PROGRAM:
    addProgramOperations(this);
    break;
  case RESOURCETYPE_IMAGE:
    addImageOperations(this);
  }
  ppEVar3 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = *ppEVar3;
  pMVar12 = (MakeCurrent *)operator_new(0x60);
  local_68.m_ptr = (Surface *)0x0;
  local_68.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = (GLES2Context *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar12,*ppEVar3,this->m_eglDisplay,&local_68,&local_78)
  ;
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pMVar12);
  ppEVar3 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = ppEVar3[1];
  pMVar12 = (MakeCurrent *)operator_new(0x60);
  local_88.m_ptr = (Surface *)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = (GLES2Context *)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar12,*ppEVar3,this->m_eglDisplay,&local_88,&local_98)
  ;
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pMVar12);
  pEVar2 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar14 = (DestroyContext *)operator_new(0x48);
  local_138.m_ptr = local_178.m_ptr;
  local_138.m_state = local_178.m_state;
  if (local_178.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_178.m_state)->strongRefCount = (local_178.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_178.m_state)->weakRefCount = (local_178.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar14,&local_138);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar14);
  if (local_138.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_138.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_138.m_ptr = (GLES2Context *)0x0;
      (*(local_138.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_138.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_138.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_138.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_138.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pEVar2 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pDVar14 = (DestroyContext *)operator_new(0x48);
  local_148.m_ptr = local_f8.m_ptr;
  local_148.m_state = local_f8.m_state;
  if (local_f8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_f8.m_state)->strongRefCount = (local_f8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_f8.m_state)->weakRefCount = (local_f8.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar14,&local_148);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar14);
  if (local_148.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_148.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_148.m_ptr = (GLES2Context *)0x0;
      (*(local_148.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_148.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_148.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_148.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_148.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pEVar2 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar15 = (DestroySurface *)operator_new(0x50);
  pvVar7 = this->m_eglDisplay;
  local_158.m_ptr = local_108.m_ptr;
  local_158.m_state = local_108.m_state;
  if (local_108.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_108.m_state)->strongRefCount = (local_108.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_108.m_state)->weakRefCount = (local_108.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar15,pvVar7,&local_158);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar15);
  if (local_158.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_158.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_158.m_ptr = (Surface *)0x0;
      (*(local_158.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_158.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_158.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_158.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_158.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pEVar2 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pDVar15 = (DestroySurface *)operator_new(0x50);
  pvVar7 = this->m_eglDisplay;
  local_168.m_ptr = local_118.m_ptr;
  local_168.m_state = local_118.m_state;
  if (local_118.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_118.m_state)->strongRefCount = (local_118.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_118.m_state)->weakRefCount = (local_118.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar15,pvVar7,&local_168);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar15);
  if (local_168.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_168.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_168.m_ptr = (Surface *)0x0;
      (*(local_168.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_168.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_168.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_168.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_168.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar5 = local_118.m_state;
  if (local_118.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.m_ptr = (Surface *)0x0;
      (*(local_118.m_state)->_vptr_SharedPtrStateBase[2])(local_118.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_118.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_118.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_108.m_state;
  if (local_108.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_108.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_108.m_ptr = (Surface *)0x0;
      (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])(local_108.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_108.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_108.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_f8.m_state;
  if (local_f8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_f8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_f8.m_ptr = (GLES2Context *)0x0;
      (*(local_f8.m_state)->_vptr_SharedPtrStateBase[2])(local_f8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_f8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_f8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_178.m_state;
  pSVar16 = local_178.m_state;
  if (local_178.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_178.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_178.m_ptr = (GLES2Context *)0x0;
      uVar6 = (*(local_178.m_state)->_vptr_SharedPtrStateBase[2])(local_178.m_state);
      pSVar16 = (SharedPtrStateBase *)(ulong)uVar6;
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_178.m_state != (SharedPtrStateBase *)0x0)) {
      uVar6 = (*(local_178.m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar16 = (SharedPtrStateBase *)(ulong)uVar6;
    }
  }
  return (int)pSVar16;
}

Assistant:

void GLES2ThreadedSharingTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	const EGLint attribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, attribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	// Check extensions
	if (m_config.useFenceSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_fence_sync");

	if (m_config.serverSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_wait_sync");

	if (m_config.resourceType == TestConfig::RESOURCETYPE_IMAGE)
	{
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_image_base");
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_gl_texture_2D_image");
	}

	// Create threads
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed)));
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed*200)));

	SharedPtr<GLES2ThreadTest::GLES2Context> contex1;
	SharedPtr<GLES2ThreadTest::GLES2Context> contex2;

	SharedPtr<GLES2ThreadTest::Surface> surface1;
	SharedPtr<GLES2ThreadTest::Surface> surface2;

	// Create contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, SharedPtr<GLES2ThreadTest::GLES2Context>(), contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, contex1, contex2));

	// Create surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface2));

	// Make current contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, surface1, contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[1], m_eglDisplay, surface2, contex2));
	// Operations to check fence sync support
	if (m_config.useFenceSync)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
		m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
	}


	switch (m_config.resourceType)
	{
		case TestConfig::RESOURCETYPE_BUFFER:
			addBufferOperations();
			break;

		case TestConfig::RESOURCETYPE_TEXTURE:
			addTextureOperations();
			break;

		case TestConfig::RESOURCETYPE_IMAGE:
			addImageOperations();
			break;

		case TestConfig::RESOURCETYPE_VERTEX_SHADER:
			addShaderOperations(GL_VERTEX_SHADER);
			break;

		case TestConfig::RESOURCETYPE_FRAGMENT_SHADER:
			addShaderOperations(GL_FRAGMENT_SHADER);
			break;

		case TestConfig::RESOURCETYPE_PROGRAM:
			addProgramOperations();
			break;

		default:
			DE_ASSERT(false);
	}

	// Relaese contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));

	// Destory context
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroyContext(contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroyContext(contex2));

	// Destroy surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface2));
}